

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O1

short * vrna_seq_encode_simple(char *sequence,vrna_md_t *md)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  short *psVar4;
  long lVar5;
  ulong uVar6;
  
  if (md == (vrna_md_t *)0x0 || sequence == (char *)0x0) {
    psVar4 = (short *)0x0;
  }
  else {
    sVar3 = strlen(sequence);
    iVar1 = (int)sVar3;
    psVar4 = (short *)vrna_alloc(iVar1 * 2 + 4);
    if (iVar1 != 0) {
      uVar6 = 2;
      if (2 < iVar1 + 1U) {
        uVar6 = (ulong)(iVar1 + 1U);
      }
      lVar5 = 0;
      do {
        iVar2 = vrna_nucleotide_encode(sequence[lVar5],md);
        psVar4[lVar5 + 1] = (short)iVar2;
        lVar5 = lVar5 + 1;
      } while (uVar6 - 1 != lVar5);
    }
    psVar4[iVar1 + 1] = psVar4[1];
    *psVar4 = (short)sVar3;
  }
  return psVar4;
}

Assistant:

PUBLIC short *
vrna_seq_encode_simple(const char *sequence,
                       vrna_md_t  *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    l = (unsigned int)strlen(sequence);
    S = (short *)vrna_alloc(sizeof(short) * (l + 2));

    for (i = 1; i <= l; i++) /* make numerical encoding of sequence */
      S[i] = (short)vrna_nucleotide_encode(sequence[i - 1], md);

    S[l + 1]  = S[1];
    S[0]      = (short)l;
  }

  return S;
}